

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O0

void mbedtls_mpi_core_cond_assign
               (mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,size_t limbs,mbedtls_ct_condition_t assign)

{
  mbedtls_mpi_uint mVar1;
  mbedtls_ct_condition_t in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  size_t i;
  ulong if1;
  
  if (in_RDI != in_RSI) {
    for (if1 = 0; if1 < in_RDX; if1 = if1 + 1) {
      mVar1 = mbedtls_ct_mpi_uint_if(in_RCX,if1,0x86f13d);
      *(mbedtls_mpi_uint *)(in_RDI + if1 * 8) = mVar1;
    }
  }
  return;
}

Assistant:

void mbedtls_mpi_core_cond_assign(mbedtls_mpi_uint *X,
                                  const mbedtls_mpi_uint *A,
                                  size_t limbs,
                                  mbedtls_ct_condition_t assign)
{
    if (X == A) {
        return;
    }

    /* This function is very performance-sensitive for RSA. For this reason
     * we have the loop below, instead of calling mbedtls_ct_memcpy_if
     * (this is more optimal since here we don't have to handle the case where
     * we copy awkwardly sized data).
     */
    for (size_t i = 0; i < limbs; i++) {
        X[i] = mbedtls_ct_mpi_uint_if(assign, A[i], X[i]);
    }
}